

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O1

SCCResult * __thiscall
StrongConnectedComponents::getAdjacencyList(StrongConnectedComponents *this,int node)

{
  uint uVar1;
  ulong *puVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pvVar5;
  ulong uVar6;
  vector<int,_std::allocator<int>_> *nodes;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  pointer *ppiVar8;
  long lVar9;
  vector<bool,_std::allocator<bool>_> *pvVar10;
  ulong uVar11;
  ulong uVar12;
  size_type __new_size;
  int iVar13;
  ulong *__s;
  int local_54;
  vector<bool,_std::allocator<bool>_> *local_50;
  SCCResult *local_48;
  ulong local_40;
  int local_34;
  
  __new_size = ((long)(this->adjListOriginal->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->adjListOriginal->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_54 = node;
  std::vector<int,_std::allocator<int>_>::resize(&this->lowlink,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->number,__new_size);
  local_50 = &this->visited;
  std::vector<bool,_std::allocator<bool>_>::resize(local_50,__new_size,false);
  __s = (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (__s != puVar2) {
    memset(__s,0,(long)puVar2 - (long)__s);
    __s = puVar2;
  }
  if (uVar1 != 0) {
    *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(&this->currentSCCs,
                    (this->currentSCCs).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  makeAdjListSubgraph(this,local_54);
  uVar12 = (ulong)local_54;
  if (uVar12 <= __new_size && __new_size - uVar12 != 0) {
    local_48 = &this->sccr_current;
    uVar11 = 0x800000000000003f;
    local_40 = 0x800000000000003f;
    pvVar10 = local_50;
    do {
      uVar6 = uVar12 + 0x3f;
      if (-1 < (long)uVar12) {
        uVar6 = uVar12;
      }
      if (((pvVar10->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar6 >> 6) +
            (ulong)((uVar12 & uVar11) < 0x8000000000000001) + 0xffffffffffffffff] >> (uVar12 & 0x3f)
          & 1) == 0) {
        getStrongConnectedComponents(this,(int)uVar12);
        nodes = getLowestIdComponent(this);
        if (nodes == (vector<int,_std::allocator<int>_> *)0x0) {
LAB_0018077e:
          iVar13 = 0;
          if (nodes != (vector<int,_std::allocator<int>_> *)0x0) {
            buildAdjList(this,nodes,local_48);
            pvVar5 = (this->sccr_current).adjList.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pvVar5 != (this->sccr_current).adjList.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              ppiVar8 = &(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              lVar9 = 0;
              do {
                if (((_Vector_impl_data *)(ppiVar8 + -1))->_M_start != *ppiVar8) {
                  (this->sccr_current).lowestNodeId = (ID_type)lVar9;
                  iVar13 = 1;
                  break;
                }
                lVar9 = lVar9 + 1;
                ppiVar8 = ppiVar8 + 3;
                iVar13 = 0;
              } while (__new_size - lVar9 != 0);
            }
          }
        }
        else {
          piVar3 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar3 == piVar4) goto LAB_0018077e;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            (piVar3,piVar4,&local_54);
          piVar3 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (_Var7._M_current != piVar3) goto LAB_0018077e;
          local_34 = local_54 + 1;
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                            ((nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start,piVar3,&local_34);
          if (_Var7._M_current !=
              (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish) goto LAB_0018077e;
          local_54 = local_54 + 1;
          iVar13 = 6;
        }
        pvVar10 = local_50;
        uVar11 = local_40;
        if ((iVar13 != 6) && (iVar13 != 0)) {
          return local_48;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 <= __new_size && __new_size - uVar12 != 0);
  }
  local_48 = &sccr_dummy;
  return local_48;
}

Assistant:

SCCResult& StrongConnectedComponents::getAdjacencyList(int node) {
    auto adjListOriginal_s = adjListOriginal.size();
    lowlink.resize(adjListOriginal_s);
    number.resize(adjListOriginal_s);
    visited.resize(adjListOriginal_s);

    while (true) {
        std::fill(visited.begin(), visited.end(), false);
        stack.clear();
        currentSCCs.clear();

        makeAdjListSubgraph(node);
        for (int i = node; i < adjListOriginal_s; i++) {
            if (!visited[i]) {
                getStrongConnectedComponents(i);
                const std::vector<int>* nodes = getLowestIdComponent();
                if (nodes != nullptr && !nodes->empty() && !find_vec(*nodes, node) &&
                    !find_vec(*nodes, node + 1)) {
                    node++;
                    continue;
                }
                else if (nodes != nullptr) {
                    buildAdjList(*nodes, sccr_current);
                    auto& adjacencyList = sccr_current.getAdjListForWrite();
                    if (!adjacencyList.empty()) {
                        for (int j = 0; j < adjListOriginal_s; j++) {
                            if (!adjacencyList[j].empty()) {
                                sccr_current.setLowestNodeId(j);
                                return sccr_current;
                            }
                        }
                    }
                }
            }
        }
        return sccr_dummy;
    }
}